

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int CmpClassPri(void *p,void *va,void *vb)

{
  int iVar1;
  nodeclass **b;
  
  if (*(short *)(*va + 0x3e) < *(short *)(*p + 0x3e)) {
    iVar1 = -1;
  }
  else {
    if (*(short *)(*va + 0x3e) <= *(short *)(*p + 0x3e)) {
      iVar1 = CmpClass(p,p,va);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static NOINLINE int CmpClassPri(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    int APriority = (*a)->Priority;
    int BPriority = (*b)->Priority;
    if (APriority > BPriority) return -1;
    if (APriority < BPriority) return 1;
    return CmpClass(NULL,a,b);
}